

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void __thiscall polyscope::Histogram::Histogram(Histogram *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [64];
  
  (this->colormapRange).first = 0.0;
  (this->colormapRange).second = 0.0;
  auVar2 = ZEXT464(0) << 0x40;
  this->smoothedHistBinCount = 0xc9;
  this->rawHistBinCount = 0x33;
  *(undefined1 (*) [64])
   &(this->weightedSmoothedHistCurveY).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar2;
  this->weightedRawHistCurveY = (vector<double,_std::allocator<double>_>)auVar2._0_24_;
  this->unweightedRawHistCurveY = (vector<double,_std::allocator<double>_>)auVar2._24_24_;
  (this->weightedSmoothedHistCurveY).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._48_8_;
  (this->weightedSmoothedHistCurveY).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar2._56_8_;
  *(undefined1 (*) [64])
   ((long)&(this->smoothedHistCurveX).
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start + 2) = auVar2;
  this->useSmoothed = true;
  this->currBufferWeighted = false;
  this->currBufferSmoothed = false;
  this->prepared = false;
  this->texDim = 600;
  auVar1 = ZEXT432(0) << 0x20;
  this->texturebuffer = (shared_ptr<polyscope::render::TextureBuffer>)auVar1._0_16_;
  this->framebuffer = (shared_ptr<polyscope::render::FrameBuffer>)auVar1._16_16_;
  this->framebuffer = (shared_ptr<polyscope::render::FrameBuffer>)auVar1._0_16_;
  this->program = (shared_ptr<polyscope::render::ShaderProgram>)auVar1._16_16_;
  (this->colormap)._M_dataplus._M_p = (pointer)&(this->colormap).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->colormap,"viridis","");
  prepare(this);
  fillBuffers(this);
  return;
}

Assistant:

Histogram::Histogram() {
  prepare();
  fillBuffers();
}